

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadExtend
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  int iVar1;
  Name memory;
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  uint64_t a;
  array<wasm::Literal,_2UL> local_3f8;
  Literal local_3c8;
  undefined1 local_3b0 [8];
  array<wasm::Literal,_2UL> lanes_2;
  Literal local_320;
  undefined1 local_308 [8];
  array<wasm::Literal,_4UL> lanes_1;
  Literal local_1e8;
  undefined1 local_1d0 [8];
  array<wasm::Literal,_8UL> lanes;
  anon_class_48_6_a8494b4f fillLanes;
  Type addressType;
  SIMDLoad *local_c0;
  Address memorySize;
  anon_class_16_2_3ef7c955 loadLane;
  undefined1 local_98 [8];
  MemoryInstanceInfo info;
  Address src;
  undefined1 local_68 [8];
  Flow flow;
  SIMDLoad *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_00,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x28)
            );
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    Flow::getSingleValue((Flow *)local_68);
    a = ::wasm::Literal::getUnsigned();
    Address::Address((Address *)&info.name.super_IString.str._M_str,a);
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_98,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x30))->str);
    memorySize.addr = (address64_t)&flow.breakTo.super_IString.str._M_str;
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    local_c0 = (SIMDLoad *)getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_98,memory);
    fillLanes.memorySize =
         *(Address **)(*(long *)(flow.breakTo.super_IString.str._M_str + 0x28) + 8);
    lanes._M_elems[7].type.id = (uintptr_t)&info.name.super_IString.str._M_str;
    fillLanes.src = (Address *)&fillLanes.memorySize;
    fillLanes.addressType = (Type *)&memorySize;
    fillLanes.loadLane = (anon_class_16_2_3ef7c955 *)local_98;
    fillLanes.info = (MemoryInstanceInfo *)&flow.breakTo.super_IString.str._M_str;
    fillLanes.curr = &local_c0;
    iVar1 = *(int *)(flow.breakTo.super_IString.str._M_str + 0x10);
    if (iVar1 - 4U < 2) {
      std::array<wasm::Literal,_8UL>::array((array<wasm::Literal,_8UL> *)local_1d0);
      std::array<wasm::Literal,_8UL>::array
                ((array<wasm::Literal,_8UL> *)&lanes_1._M_elems[3].type,
                 (array<wasm::Literal,_8UL> *)local_1d0);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                (&local_1e8,&lanes._M_elems[7].type,
                 (array<wasm::Literal,_8UL> *)&lanes_1._M_elems[3].type,1);
      Flow::Flow(__return_storage_ptr__,&local_1e8);
      ::wasm::Literal::~Literal(&local_1e8);
      std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lanes_1._M_elems[3].type)
      ;
      std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_1d0);
    }
    else if (iVar1 - 6U < 2) {
      std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)local_308);
      std::array<wasm::Literal,_4UL>::array
                ((array<wasm::Literal,_4UL> *)&lanes_2._M_elems[1].type,
                 (array<wasm::Literal,_4UL> *)local_308);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                (&local_320,&lanes._M_elems[7].type,
                 (array<wasm::Literal,_4UL> *)&lanes_2._M_elems[1].type,2);
      Flow::Flow(__return_storage_ptr__,&local_320);
      ::wasm::Literal::~Literal(&local_320);
      std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&lanes_2._M_elems[1].type)
      ;
      std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_308);
    }
    else {
      if (1 < iVar1 - 8U) {
        ::wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xf33);
      }
      std::array<wasm::Literal,_2UL>::array((array<wasm::Literal,_2UL> *)local_3b0);
      std::array<wasm::Literal,_2UL>::array(&local_3f8,(array<wasm::Literal,_2UL> *)local_3b0);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                (&local_3c8,&lanes._M_elems[7].type,&local_3f8,4);
      Flow::Flow(__return_storage_ptr__,&local_3c8);
      ::wasm::Literal::~Literal(&local_3c8);
      std::array<wasm::Literal,_2UL>::~array(&local_3f8);
      std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_3b0);
    }
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadExtend(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    Address src(flow.getSingleValue().getUnsigned());
    auto info = getMemoryInstanceInfo(curr->memory);
    auto loadLane = [&](Address addr) {
      switch (curr->op) {
        case Load8x8SVec128:
          return Literal(int32_t(info.interface()->load8s(addr, info.name)));
        case Load8x8UVec128:
          return Literal(int32_t(info.interface()->load8u(addr, info.name)));
        case Load16x4SVec128:
          return Literal(int32_t(info.interface()->load16s(addr, info.name)));
        case Load16x4UVec128:
          return Literal(int32_t(info.interface()->load16u(addr, info.name)));
        case Load32x2SVec128:
          return Literal(int64_t(info.interface()->load32s(addr, info.name)));
        case Load32x2UVec128:
          return Literal(int64_t(info.interface()->load32u(addr, info.name)));
        default:
          WASM_UNREACHABLE("unexpected op");
      }
      WASM_UNREACHABLE("invalid op");
    };
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addressType = curr->ptr->type;
    auto fillLanes = [&](auto lanes, size_t laneBytes) {
      for (auto& lane : lanes) {
        auto ptr = Literal::makeFromInt64(src, addressType);
        lane = loadLane(
          info.instance->getFinalAddress(curr, ptr, laneBytes, memorySize));
        src =
          ptr.add(Literal::makeFromInt32(laneBytes, addressType)).getUnsigned();
      }
      return Literal(lanes);
    };
    switch (curr->op) {
      case Load8x8SVec128:
      case Load8x8UVec128: {
        std::array<Literal, 8> lanes;
        return fillLanes(lanes, 1);
      }
      case Load16x4SVec128:
      case Load16x4UVec128: {
        std::array<Literal, 4> lanes;
        return fillLanes(lanes, 2);
      }
      case Load32x2SVec128:
      case Load32x2UVec128: {
        std::array<Literal, 2> lanes;
        return fillLanes(lanes, 4);
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    WASM_UNREACHABLE("invalid op");
  }